

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O2

FT_Error ft_smooth_render(FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                         FT_Vector *origin)

{
  FT_UInt *pFVar1;
  uchar **ppuVar2;
  FT_Vector FVar3;
  uint uVar4;
  FT_Memory memory;
  FT_Library pFVar5;
  undefined1 auVar6 [12];
  FT_Bool FVar7;
  int iVar8;
  uchar *puVar9;
  FT_Vector *pFVar10;
  int iVar11;
  long lVar12;
  FT_Vector *pFVar13;
  long lVar14;
  long lVar15;
  long xOffset;
  long yOffset;
  FT_Vector *pFVar16;
  FT_Pos *pFVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  ulong uVar20;
  FT_Error error;
  FT_Outline *local_b8;
  FT_Bitmap *local_b0;
  FT_Memory local_a8;
  uchar *local_a0;
  int local_98;
  FT_Raster_Params params;
  
  error = 0;
  local_b8 = &slot->outline;
  memory = (render->root).memory;
  local_a8 = memory;
  if (slot->format == render->glyph_format) {
    if ((FT_RENDER_MODE_LCD_V < mode) || (mode == FT_RENDER_MODE_MONO)) {
      error = 0x13;
      goto LAB_0020e6e6;
    }
    if ((slot->internal->flags & 1) != 0) {
      ft_mem_free(memory,(slot->bitmap).buffer);
      (slot->bitmap).buffer = (uchar *)0x0;
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 & 0xfffffffe;
    }
    FVar7 = ft_glyphslot_preset_bitmap(slot,mode,origin);
    if (FVar7 != '\0') {
      error = 0x62;
      goto LAB_0020e6e6;
    }
    uVar18 = (ulong)(slot->bitmap).rows;
    if ((uVar18 == 0) || (lVar15 = (long)(slot->bitmap).pitch, lVar15 == 0)) {
      yOffset = 0;
      lVar15 = 0;
LAB_0020e872:
      slot->format = FT_GLYPH_FORMAT_BITMAP;
      goto LAB_0020e71d;
    }
    yOffset = 0;
    local_b0 = &slot->bitmap;
    puVar9 = (uchar *)ft_mem_realloc(memory,lVar15,0,uVar18,(void *)0x0,&error);
    (slot->bitmap).buffer = puVar9;
    lVar15 = 0;
    if (error == 0) {
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      lVar15 = (long)(slot->bitmap_left * -0x40);
      iVar11 = (slot->bitmap).rows << 6;
      iVar8 = iVar11 / 3;
      if ((slot->bitmap).pixel_mode != '\x06') {
        iVar8 = iVar11;
      }
      yOffset = (long)iVar8 + (long)(slot->bitmap_top * -0x40);
      if (origin != (FT_Vector *)0x0) {
        lVar15 = lVar15 + origin->x;
        yOffset = yOffset + origin->y;
      }
      if (lVar15 != 0 || yOffset != 0) {
        FT_Outline_Translate(local_b8,lVar15,yOffset);
      }
      if (mode < FT_RENDER_MODE_MONO) {
        if (((slot->outline).flags & 0x40) == 0) {
          params.target = local_b0;
          params.source = local_b8;
          params.flags = 1;
          error = (*render->raster_render)(render->raster,&params);
        }
        else {
          pFVar13 = (slot->outline).points;
          if (pFVar13 == (FT_Vector *)0x0) {
            pFVar16 = (FT_Vector *)0x0;
          }
          else {
            pFVar16 = pFVar13 + (slot->outline).n_points;
          }
          uVar4 = (slot->bitmap).width;
          if ((uVar4 & 0x3fffe000) == 0) {
            params.source = local_b8;
            params.flags = 3;
            params.gray_spans = ft_smooth_overlap_spans;
            params.user = &local_a0;
            params.clip_box.xMax = (FT_Pos)(uVar4 << 2);
            params.clip_box.xMin = 0;
            params.clip_box.yMin = 0;
            uVar4 = (slot->bitmap).rows;
            params.clip_box.yMax = (FT_Pos)(uVar4 * 4);
            local_98 = (slot->bitmap).pitch;
            uVar18 = 0;
            if (-1 < local_98) {
              uVar18 = (ulong)((uVar4 - 1) * local_98);
            }
            local_a0 = (slot->bitmap).buffer + uVar18;
            for (pFVar10 = pFVar13; pFVar10 < pFVar16; pFVar10 = pFVar10 + 1) {
              pFVar10->x = pFVar10->x << 2;
              pFVar10->y = pFVar10->y << 2;
            }
            error = (*render->raster_render)(render->raster,&params);
            for (; pFVar13 < pFVar16; pFVar13 = pFVar13 + 1) {
              FVar3 = *pFVar13;
              auVar6._4_8_ = FVar3.y;
              auVar6._0_4_ = FVar3.x._4_4_ >> 0x1f;
              auVar19._0_8_ = auVar6._0_8_ << 0x20;
              auVar19._8_4_ = (int)FVar3.y >> 0x1f;
              auVar19._12_4_ = FVar3.y._4_4_ >> 0x1f;
              uVar18 = (auVar19._0_8_ >> 0x3e) + FVar3.x;
              uVar20 = (auVar19._8_8_ >> 0x3e) + FVar3.y;
              pFVar13->x = CONCAT44((int)((long)uVar18 >> 0x22),(int)(uVar18 >> 2));
              *(int *)&pFVar13[1].x = (int)(uVar20 >> 2);
              *(int *)((long)&pFVar13[1].x + 4) = (int)((long)uVar20 >> 0x22);
            }
          }
          else {
            error = 0x62;
          }
        }
      }
      else if (mode == FT_RENDER_MODE_LCD) {
        pFVar5 = (render->root).library;
        params.source = local_b8;
        params.flags = 3;
        params.gray_spans = ft_smooth_lcd_spans;
        params.user = &local_a0;
        params.clip_box.xMin = 0;
        params.clip_box.yMin = 0;
        params.clip_box.xMax = (FT_Pos)(slot->bitmap).width;
        uVar4 = (slot->bitmap).rows;
        params.clip_box.yMax = (FT_Pos)uVar4;
        local_98 = (slot->bitmap).pitch;
        uVar18 = (ulong)((uVar4 - 1) * local_98);
        if (local_98 < 0) {
          uVar18 = 0;
        }
        local_a0 = (slot->bitmap).buffer + uVar18;
        FT_Outline_Translate(local_b8,-pFVar5->lcd_geometry[0].x,-pFVar5->lcd_geometry[0].y);
        iVar8 = (*render->raster_render)(render->raster,&params);
        if (iVar8 == 0) {
          local_a0 = local_a0 + 1;
          FT_Outline_Translate
                    (local_b8,pFVar5->lcd_geometry[0].x - pFVar5->lcd_geometry[1].x,
                     pFVar5->lcd_geometry[0].y - pFVar5->lcd_geometry[1].y);
          iVar8 = (*render->raster_render)(render->raster,&params);
          if (iVar8 == 0) {
            local_a0 = local_a0 + 1;
            pFVar13 = pFVar5->lcd_geometry + 2;
            pFVar17 = &pFVar5->lcd_geometry[2].y;
            FT_Outline_Translate
                      (local_b8,pFVar5->lcd_geometry[1].x - pFVar5->lcd_geometry[2].x,
                       pFVar5->lcd_geometry[1].y - pFVar5->lcd_geometry[2].y);
            iVar8 = (*render->raster_render)(render->raster,&params);
          }
          else {
            pFVar13 = pFVar5->lcd_geometry + 1;
            pFVar17 = &pFVar5->lcd_geometry[1].y;
          }
        }
        else {
          pFVar13 = pFVar5->lcd_geometry;
          pFVar17 = &pFVar5->lcd_geometry[0].y;
        }
        FT_Outline_Translate(local_b8,pFVar13->x,*pFVar17);
        error = iVar8;
      }
      else if (mode == FT_RENDER_MODE_LCD_V) {
        iVar8 = (slot->bitmap).pitch;
        pFVar5 = (render->root).library;
        params.target = local_b0;
        params.source = local_b8;
        params.flags = 1;
        (slot->bitmap).pitch = iVar8 * 3;
        (slot->bitmap).rows = (slot->bitmap).rows / 3;
        local_b0 = (FT_Bitmap *)(long)iVar8;
        FT_Outline_Translate(local_b8,-pFVar5->lcd_geometry[0].y,pFVar5->lcd_geometry[0].x);
        iVar8 = (*render->raster_render)(render->raster,&params);
        lVar12 = pFVar5->lcd_geometry[0].x;
        xOffset = pFVar5->lcd_geometry[0].y;
        if (iVar8 == 0) {
          ppuVar2 = &(slot->bitmap).buffer;
          *ppuVar2 = *ppuVar2 + (long)local_b0;
          FT_Outline_Translate
                    (local_b8,xOffset - pFVar5->lcd_geometry[1].y,pFVar5->lcd_geometry[1].x - lVar12
                    );
          iVar8 = (*render->raster_render)(render->raster,&params);
          lVar12 = pFVar5->lcd_geometry[1].x;
          xOffset = pFVar5->lcd_geometry[1].y;
          puVar9 = (slot->bitmap).buffer + -(long)local_b0;
          (slot->bitmap).buffer = puVar9;
          if (iVar8 == 0) {
            lVar14 = (long)((int)local_b0 * 2);
            (slot->bitmap).buffer = puVar9 + lVar14;
            FT_Outline_Translate
                      (local_b8,xOffset - pFVar5->lcd_geometry[2].y,
                       pFVar5->lcd_geometry[2].x - lVar12);
            iVar8 = (*render->raster_render)(render->raster,&params);
            lVar12 = pFVar5->lcd_geometry[2].x;
            xOffset = pFVar5->lcd_geometry[2].y;
            ppuVar2 = &(slot->bitmap).buffer;
            *ppuVar2 = *ppuVar2 + -lVar14;
          }
        }
        FT_Outline_Translate(local_b8,xOffset,-lVar12);
        (slot->bitmap).pitch = (slot->bitmap).pitch / 3;
        (slot->bitmap).rows = (slot->bitmap).rows * 3;
        error = iVar8;
      }
      if (error == 0) goto LAB_0020e872;
    }
  }
  else {
    error = 6;
LAB_0020e6e6:
    yOffset = 0;
    lVar15 = 0;
  }
  if ((slot->internal->flags & 1) != 0) {
    ft_mem_free(local_a8,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffe;
  }
LAB_0020e71d:
  if (lVar15 != 0 || yOffset != 0) {
    FT_Outline_Translate(local_b8,-lVar15,-yOffset);
  }
  return error;
}

Assistant:

static FT_Error
  ft_smooth_render( FT_Renderer       render,
                    FT_GlyphSlot      slot,
                    FT_Render_Mode    mode,
                    const FT_Vector*  origin )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check mode */
    if ( mode != FT_RENDER_MODE_NORMAL &&
         mode != FT_RENDER_MODE_LIGHT  &&
         mode != FT_RENDER_MODE_LCD    &&
         mode != FT_RENDER_MODE_LCD_V  )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( ft_glyphslot_preset_bitmap( slot, mode, origin ) )
    {
      error = FT_THROW( Raster_Overflow );
      goto Exit;
    }

    if ( !bitmap->rows || !bitmap->pitch )
      goto Exit;

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = 64 * -slot->bitmap_left;
    y_shift = 64 * -slot->bitmap_top;
    if ( bitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      y_shift += 64 * (FT_Int)bitmap->rows / 3;
    else
      y_shift += 64 * (FT_Int)bitmap->rows;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    if ( mode == FT_RENDER_MODE_NORMAL ||
         mode == FT_RENDER_MODE_LIGHT  )
    {
      if ( outline->flags & FT_OUTLINE_OVERLAP )
        error = ft_smooth_raster_overlap( render, outline, bitmap );
      else
      {
        FT_Raster_Params  params;


        params.target = bitmap;
        params.source = outline;
        params.flags  = FT_RASTER_FLAG_AA;

        error = render->raster_render( render->raster, &params );
      }
    }
    else
    {
      if ( mode == FT_RENDER_MODE_LCD )
        error = ft_smooth_raster_lcd ( render, outline, bitmap );
      else if ( mode == FT_RENDER_MODE_LCD_V )
        error = ft_smooth_raster_lcdv( render, outline, bitmap );

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING

      /* finally apply filtering */
      {
        FT_Byte*                 lcd_weights;
        FT_Bitmap_LcdFilterFunc  lcd_filter_func;


        /* Per-face LCD filtering takes priority if set up. */
        if ( slot->face && slot->face->internal->lcd_filter_func )
        {
          lcd_weights     = slot->face->internal->lcd_weights;
          lcd_filter_func = slot->face->internal->lcd_filter_func;
        }
        else
        {
          lcd_weights     = slot->library->lcd_weights;
          lcd_filter_func = slot->library->lcd_filter_func;
        }

        if ( lcd_filter_func )
          lcd_filter_func( bitmap, lcd_weights );
      }

#endif /* FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

    }

  Exit:
    if ( !error )
    {
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    }
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }